

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_PartialEqualityTestTwoBoolsPresenceFieldMissingWithAddress_Test::TestBody
          (MessageDifferencerTest_PartialEqualityTestTwoBoolsPresenceFieldMissingWithAddress_Test
           *this)

{
  bool bVar1;
  FieldDescriptor *fd;
  char *in_R9;
  pointer *__ptr;
  Metadata MVar2;
  TestNoPresenceField msg2;
  MessageDifferencer default_differencer;
  MessageDifferencer address_differencer;
  AssertHelper local_460;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_458;
  internal local_450 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_448;
  string local_440;
  TestNoPresenceField local_420;
  UnsetFieldsMetadata local_3d8;
  TestNoPresenceField local_3b8;
  MessageDifferencer local_370;
  MessageDifferencer local_1c0;
  
  util::MessageDifferencer::MessageDifferencer(&local_1c0);
  util::MessageDifferencer::set_scope(&local_1c0,PARTIAL);
  util::MessageDifferencer::MessageDifferencer(&local_370);
  util::MessageDifferencer::set_scope(&local_370,PARTIAL);
  util::MessageDifferencer::set_force_compare_no_presence(&local_370,false);
  MakeTestNoPresenceField();
  MakeTestNoPresenceField();
  MVar2 = proto3_unittest::TestNoPresenceField::GetMetadata
                    ((TestNoPresenceField *)proto3_unittest::_TestNoPresenceField_default_instance_)
  ;
  fd = Descriptor::FindFieldByNumber(MVar2.descriptor,5);
  local_3d8.ids_.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  local_3d8.ids_.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  protobuf::internal::UnsetFieldsMetadataMessageDifferencerTestUtil::AddExplicitUnsetField
            (&local_420.super_Message,fd,&local_3d8);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::operator=((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
               *)&local_1c0.require_no_presence_fields_,
              (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
               *)&local_3d8);
  local_450[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_1c0,&local_420.super_Message,&local_3b8.super_Message);
  local_448 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_450[0]) {
    testing::Message::Message((Message *)&local_458);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_440,local_450,(AssertionResult *)"address_differencer.Compare(msg1, msg2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1f7,local_440._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_460,(Message *)&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    if (local_458._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_458._M_head_impl + 8))();
    }
    if (local_448 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_448,local_448);
    }
  }
  local_450[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_370,&local_420.super_Message,&local_3b8.super_Message);
  local_448 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_450[0]) {
    testing::Message::Message((Message *)&local_458);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_440,local_450,(AssertionResult *)"default_differencer.Compare(msg1, msg2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1f8,local_440._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_460,(Message *)&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    if (local_458._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_458._M_head_impl + 8))();
    }
    if (local_448 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_448,local_448);
    }
  }
  local_420.field_0._49_2_ = (ushort)local_420.field_0._impl_.no_presence_bool3_ << 8;
  local_420.field_0._impl_._has_bits_.has_bits_[0] =
       (HasBits<1>)((uint)local_420.field_0._impl_._has_bits_.has_bits_[0] & 0xfffffff7);
  bVar1 = util::MessageDifferencer::Compare
                    (&local_1c0,&local_420.super_Message,&local_3b8.super_Message);
  local_450[0] = (internal)!bVar1;
  local_448 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_458);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_440,local_450,(AssertionResult *)"address_differencer.Compare(msg1, msg2)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1fd,local_440._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_460,(Message *)&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    if (local_458._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_458._M_head_impl + 8))();
    }
    if (local_448 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_448,local_448);
    }
  }
  local_450[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_370,&local_420.super_Message,&local_3b8.super_Message);
  local_448 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_450[0]) {
    testing::Message::Message((Message *)&local_458);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_440,local_450,(AssertionResult *)"default_differencer.Compare(msg1, msg2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1fe,local_440._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_460,(Message *)&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    if (local_458._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_458._M_head_impl + 8))();
    }
    if (local_448 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_448,local_448);
    }
  }
  local_420.field_0._49_2_ = 1;
  local_420.field_0._impl_._has_bits_.has_bits_[0] =
       (HasBits<1>)((uint)local_420.field_0._impl_._has_bits_.has_bits_[0] & 0xffffffe7 | 8);
  local_450[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_1c0,&local_420.super_Message,&local_3b8.super_Message);
  local_448 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_450[0]) {
    testing::Message::Message((Message *)&local_458);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_440,local_450,(AssertionResult *)"address_differencer.Compare(msg1, msg2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x204,local_440._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_460,(Message *)&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    if (local_458._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_458._M_head_impl + 8))();
    }
    if (local_448 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_448,local_448);
    }
  }
  local_450[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_370,&local_420.super_Message,&local_3b8.super_Message);
  local_448 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_450[0]) {
    testing::Message::Message((Message *)&local_458);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_440,local_450,(AssertionResult *)"default_differencer.Compare(msg1, msg2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x205,local_440._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_460,(Message *)&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    if (local_458._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_458._M_head_impl + 8))();
    }
    if (local_448 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_448,local_448);
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                     *)&local_3d8);
  proto3_unittest::TestNoPresenceField::~TestNoPresenceField(&local_3b8);
  proto3_unittest::TestNoPresenceField::~TestNoPresenceField(&local_420);
  util::MessageDifferencer::~MessageDifferencer(&local_370);
  util::MessageDifferencer::~MessageDifferencer(&local_1c0);
  return;
}

Assistant:

TEST(MessageDifferencerTest,
     PartialEqualityTestTwoBoolsPresenceFieldMissingWithAddress) {
  util::MessageDifferencer address_differencer;
  address_differencer.set_scope(util::MessageDifferencer::PARTIAL);

  // This differencer is not setting force_compare_no_presence.
  util::MessageDifferencer default_differencer;
  default_differencer.set_scope(util::MessageDifferencer::PARTIAL);
  default_differencer.set_force_compare_no_presence(false);

  // When clearing a singular no presence field, it will be included in the
  // comparison.
  proto3_unittest::TestNoPresenceField msg1 = MakeTestNoPresenceField();
  proto3_unittest::TestNoPresenceField msg2 = MakeTestNoPresenceField();

  const FieldDescriptor* fd1 = msg1.GetDescriptor()->FindFieldByNumber(5);
  TextFormat::Parser::UnsetFieldsMetadata metadata;
  UnsetFieldsMetadataMessageDifferencerTestUtil::AddExplicitUnsetField(
      msg1, *fd1, &metadata);
  address_differencer.set_require_no_presence_fields(metadata);

  EXPECT_TRUE(address_differencer.Compare(msg1, msg2));
  EXPECT_TRUE(default_differencer.Compare(msg1, msg2));

  // Trigger on bool2.
  msg1.clear_no_presence_bool2();

  EXPECT_FALSE(address_differencer.Compare(msg1, msg2));
  EXPECT_TRUE(default_differencer.Compare(msg1, msg2));

  // Triggering on bool2 still ignores bool3.
  msg1.set_no_presence_bool2(true);
  msg1.clear_no_presence_bool3();

  EXPECT_TRUE(address_differencer.Compare(msg1, msg2));
  EXPECT_TRUE(default_differencer.Compare(msg1, msg2));
}